

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O3

void prvTidySortAttributes(TidyDocImpl *doc,Node *node,TidyAttrSortStrategy strat)

{
  tmbstr *pptVar1;
  int iVar2;
  AttVal *pAVar3;
  AttVal *pAVar4;
  AttVal *pAVar5;
  code *pcVar6;
  int iVar7;
  AttVal *pAVar8;
  AttVal *pAVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  bool bVar13;
  AttVal *local_60;
  
  if (node != (Node *)0x0) {
    do {
      local_60 = node->attributes;
      pptVar1 = (doc->attribs).priorityAttribs.list;
      pcVar6 = AlphaComparator;
      if ((strat == TidySortAttrAlpha) ||
         (((strat == TidySortAttrNone && (pptVar1 != (tmbstr *)0x0)) &&
          (pcVar6 = PriorityComparator, *pptVar1 != (tmbstr)0x0)))) {
        if (local_60 != (AttVal *)0x0) {
          iVar10 = 1;
          pAVar9 = local_60;
LAB_001385f0:
          pAVar8 = (AttVal *)0x0;
          local_60 = (AttVal *)0x0;
          iVar12 = 0;
LAB_0013860f:
          iVar7 = iVar12;
          pAVar3 = pAVar9;
          iVar12 = 0;
          if (0 < iVar10) {
            iVar11 = 1;
            do {
              pAVar3 = pAVar3->next;
              if (pAVar3 == (AttVal *)0x0) {
                pAVar3 = (AttVal *)0x0;
                iVar12 = iVar11;
                break;
              }
              bVar13 = iVar11 != iVar10;
              iVar11 = iVar11 + 1;
              iVar12 = iVar10;
            } while (bVar13);
          }
          pAVar4 = pAVar9;
          pAVar5 = pAVar8;
          pAVar9 = pAVar3;
          iVar11 = iVar10;
          pAVar3 = local_60;
          do {
            local_60 = pAVar3;
            pAVar8 = pAVar5;
            if (iVar12 < 1) {
              if ((iVar11 < 1) || (pAVar9 == (AttVal *)0x0)) goto LAB_00138708;
              if (iVar12 != 0) goto LAB_0013867b;
              iVar11 = iVar11 + -1;
              iVar12 = 0;
              pAVar3 = pAVar9->next;
              pAVar5 = pAVar9;
            }
            else {
LAB_0013867b:
              pAVar3 = pAVar9;
              pAVar5 = pAVar4;
              if ((iVar11 == 0) || (pAVar9 == (AttVal *)0x0)) {
                iVar12 = iVar12 + -1;
                pAVar4 = pAVar4->next;
              }
              else {
                iVar2 = (*pcVar6)(pAVar4,pAVar9,pptVar1);
                if (iVar2 < 1) {
                  pAVar4 = pAVar4->next;
                  iVar12 = iVar12 + -1;
                }
                else {
                  iVar11 = iVar11 + -1;
                  pAVar3 = pAVar9->next;
                  pAVar5 = pAVar9;
                }
              }
            }
            pAVar9 = pAVar3;
            pAVar3 = pAVar5;
            if (pAVar8 != (AttVal *)0x0) {
              pAVar8->next = pAVar5;
              pAVar3 = local_60;
            }
          } while( true );
        }
        local_60 = (AttVal *)0x0;
      }
LAB_0013873f:
      node->attributes = local_60;
      if (node->content != (Node *)0x0) {
        prvTidySortAttributes(doc,node->content,strat);
      }
      node = node->next;
    } while (node != (Node *)0x0);
  }
  return;
LAB_00138708:
  iVar12 = iVar7 + 1;
  if (pAVar9 == (AttVal *)0x0) goto code_r0x00138720;
  goto LAB_0013860f;
code_r0x00138720:
  pAVar8->next = (AttVal *)0x0;
  iVar10 = iVar10 * 2;
  pAVar9 = local_60;
  if (iVar7 == 0) goto LAB_0013873f;
  goto LAB_001385f0;
}

Assistant:

void TY_(SortAttributes)(TidyDocImpl* doc, Node* node, TidyAttrSortStrategy strat)
{
    while (node)
    {
        node->attributes = SortAttVal( doc, node->attributes, strat );
        if (node->content)
            TY_(SortAttributes)(doc, node->content, strat);
        node = node->next;
    }
}